

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<std::vector<int,_std::allocator<int>_>_>::load(BinaryBuffer *bb,Vector *v)

{
  value_type_conflict local_24;
  size_t s;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  local_24 = 0;
  std::vector<int,_std::allocator<int>_>::resize(v,s,&local_24);
  if (s != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start,s << 2);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }